

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveDefineArea(Parser *parser,int flags)

{
  bool bVar1;
  byte in_DL;
  undefined4 in_register_00000034;
  bool shared;
  CDirectiveArea *local_30;
  vector<Expression,_std::allocator<Expression>_> parameters;
  
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList
                    ((Parser *)CONCAT44(in_register_00000034,flags),&parameters,2,3);
  if (bVar1) {
    shared = (bool)(in_DL & 1);
    std::make_unique<CDirectiveArea,bool&,Expression&>((bool *)&local_30,(Expression *)&shared);
    CDirectiveArea::setPositionExpression
              (local_30,parameters.super__Vector_base<Expression,_std::allocator<Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if ((long)parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x48) {
      CDirectiveArea::setFillExpression
                (local_30,parameters.super__Vector_base<Expression,_std::allocator<Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start + 2);
    }
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_30;
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&parameters);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveDefineArea(Parser& parser, int flags)
{
	std::vector<Expression> parameters;
	if (!parser.parseExpressionList(parameters,2,3))
		return nullptr;

	bool shared = (flags & DIRECTIVE_AREA_SHARED) != 0;
	auto area = std::make_unique<CDirectiveArea>(shared, parameters[1]);
	area->setPositionExpression(parameters[0]);
	if (parameters.size() == 3)
		area->setFillExpression(parameters[2]);

	return area;
}